

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

int __thiscall BigInt::get_real_length(BigInt *this)

{
  pointer piVar1;
  const_iterator __last;
  int iVar2;
  const_iterator __first;
  uint uVar3;
  ulong uVar4;
  
  piVar1 = (this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __last._M_current =
       (this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  uVar4 = (ulong)((long)__last._M_current - (long)piVar1) >> 2;
  this->real_length = 0;
  __first._M_current = __last._M_current + 1;
  do {
    uVar3 = (int)uVar4 - 1;
    uVar4 = (ulong)uVar3;
    __first._M_current = __first._M_current + -1;
    if (piVar1[(int)uVar3] != 0) break;
  } while (1 < (int)uVar3);
  std::vector<int,_std::allocator<int>_>::erase(&this->value,__first,__last);
  iVar2 = this->real_length;
  for (; 0 < (int)uVar4; uVar4 = (ulong)((int)uVar4 - 1)) {
    iVar2 = iVar2 + 1;
    this->real_length = iVar2;
  }
  return iVar2;
}

Assistant:

int BigInt::get_real_length() {
    /*
     * not include the sign bit
     */
    int i = this->value.size() - 1;
    int j = 0;
    this->real_length = 0;
    while (this->value[i] == 0 && i > 1) {
        --i;
        ++j;
    }
    this->value.erase(this->value.end() - j, this->value.end());
    while (i > 0) {
        ++this->real_length;
        --i;
    }
    return this->real_length;
}